

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test::TestBody
          (SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test *this)

{
  string *psVar1;
  undefined8 *puVar2;
  AssertHelper local_178;
  Message local_170 [5];
  AssertionResult gtest_ar;
  InvalidSubjectException *e;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [48];
  FX local_b0 [64];
  undefined8 local_70;
  string local_68 [24];
  Subject local_50 [24];
  string local_38 [32];
  SubjectFactory local_18 [8];
  SubjectFactory subject_factory;
  SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test *this_local;
  
  _subject_factory = this;
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_18,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_70 = bidfx_public_api::price::subject::SubjectFactory::FX::Quote();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"EURGBP",&local_e1);
  psVar1 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"EUR",&local_109);
  bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar1);
  psVar1 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(0.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"CSFX",(allocator<char> *)((long)&e + 7));
  puVar2 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider(psVar1);
  (**(code **)*puVar2)(local_50);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  std::__cxx11::string::c_str();
  std::__cxx11::string::~string(local_38);
  Subject::~Subject(local_50);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  SubjectFactory::FX::~FX(local_b0);
  testing::Message::Message(local_170);
  testing::internal::AssertHelper::AssertHelper
            (&local_178,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
             ,0xc5,"Failed");
  testing::internal::AssertHelper::operator=(&local_178,local_170);
  testing::internal::AssertHelper::~AssertHelper(&local_178);
  testing::Message::~Message(local_170);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_Quantity_must_not_be_zero)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .Quantity(0)
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "dealt quantity must be a positive value: 0.00");
        return;
    }

    FAIL();
}